

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_3::DBIter::FindPrevUserEntry(DBIter *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  ulong uVar4;
  undefined4 extraout_var_00;
  long extraout_RDX;
  ValueType VVar5;
  string empty;
  ParsedInternalKey ikey;
  
  iVar2 = (*this->iter_->_vptr_Iterator[2])();
  if ((char)iVar2 != '\0') {
    VVar5 = kTypeDeletion;
    do {
      ikey.user_key.data_ = "";
      ikey.user_key.size_ = 0;
      bVar1 = ParseKey(this,&ikey);
      if ((bVar1) && (ikey.sequence <= this->sequence_)) {
        if (VVar5 != kTypeDeletion) {
          empty._M_dataplus._M_p = (this->saved_key_)._M_dataplus._M_p;
          empty._M_string_length = (this->saved_key_)._M_string_length;
          iVar2 = (*this->user_comparator_->_vptr_Comparator[2])
                            (this->user_comparator_,&ikey,&empty);
          if (iVar2 < 0) goto LAB_0010f3b7;
        }
        VVar5 = ikey.type;
        if (ikey.type == kTypeDeletion) {
          (this->saved_key_)._M_string_length = 0;
          *(this->saved_key_)._M_dataplus._M_p = '\0';
          ClearSavedValue(this);
          VVar5 = kTypeDeletion;
        }
        else {
          iVar2 = (*this->iter_->_vptr_Iterator[9])();
          uVar4 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(this->saved_value_)._M_dataplus._M_p != &(this->saved_value_).field_2) {
            uVar4 = (this->saved_value_).field_2._M_allocated_capacity;
          }
          if (extraout_RDX + 0x100000U < uVar4) {
            empty._M_dataplus._M_p = (pointer)&empty.field_2;
            empty._M_string_length = 0;
            empty.field_2._M_local_buf[0] = '\0';
            std::__cxx11::string::swap((string *)&empty);
            std::__cxx11::string::_M_dispose();
          }
          iVar3 = (*this->iter_->_vptr_Iterator[8])();
          std::__cxx11::string::assign((char *)&this->saved_key_,CONCAT44(extraout_var_00,iVar3));
          std::__cxx11::string::assign((char *)&this->saved_value_,CONCAT44(extraout_var,iVar2));
        }
      }
      (*this->iter_->_vptr_Iterator[7])();
      iVar2 = (*this->iter_->_vptr_Iterator[2])();
    } while ((char)iVar2 != '\0');
    if (VVar5 != kTypeDeletion) {
LAB_0010f3b7:
      this->valid_ = true;
      return;
    }
  }
  this->valid_ = false;
  (this->saved_key_)._M_string_length = 0;
  *(this->saved_key_)._M_dataplus._M_p = '\0';
  ClearSavedValue(this);
  this->direction_ = kForward;
  return;
}

Assistant:

void DBIter::FindPrevUserEntry() {
  assert(direction_ == kReverse);

  ValueType value_type = kTypeDeletion;
  if (iter_->Valid()) {
    do {
      ParsedInternalKey ikey;
      if (ParseKey(&ikey) && ikey.sequence <= sequence_) {
        if ((value_type != kTypeDeletion) &&
            user_comparator_->Compare(ikey.user_key, saved_key_) < 0) {
          // We encountered a non-deleted value in entries for previous keys,
          break;
        }
        value_type = ikey.type;
        if (value_type == kTypeDeletion) {
          saved_key_.clear();
          ClearSavedValue();
        } else {
          Slice raw_value = iter_->value();
          if (saved_value_.capacity() > raw_value.size() + 1048576) {
            std::string empty;
            swap(empty, saved_value_);
          }
          SaveKey(ExtractUserKey(iter_->key()), &saved_key_);
          saved_value_.assign(raw_value.data(), raw_value.size());
        }
      }
      iter_->Prev();
    } while (iter_->Valid());
  }

  if (value_type == kTypeDeletion) {
    // End
    valid_ = false;
    saved_key_.clear();
    ClearSavedValue();
    direction_ = kForward;
  } else {
    valid_ = true;
  }
}